

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O0

void __thiscall
PrimitiveDisplayer::drawableWithManualRotation(PrimitiveDisplayer *this,Drawable *drawable)

{
  float fVar1;
  Quad *quad_00;
  bool bVar2;
  int iVar3;
  Vec2d *pVVar4;
  vector<Quad_*,_std::allocator<Quad_*>_> *this_00;
  reference ppQVar5;
  float fVar6;
  float fVar7;
  Quad *quad;
  iterator __end1;
  iterator __begin1;
  vector<Quad_*,_std::allocator<Quad_*>_> *__range1;
  float rot;
  Vec2d *coords;
  Drawable *drawable_local;
  PrimitiveDisplayer *this_local;
  
  pVVar4 = (Vec2d *)(**(code **)(*(long *)(&drawable->field_0x0 + *(long *)((long)*drawable + -0x50)
                                          ) + 0x10))
                              (&drawable->field_0x0 + *(long *)((long)*drawable + -0x50));
  iVar3 = (**(code **)(*(long *)(&drawable->field_0x0 + *(long *)((long)*drawable + -0x50)) + 0x28))
                    (&drawable->field_0x0 + *(long *)((long)*drawable + -0x50));
  glPushMatrix();
  fVar6 = Vec2d::getX(pVVar4);
  fVar1 = this->pixelsPerSquare;
  fVar7 = Vec2d::getY(pVVar4);
  glTranslatef((fVar6 + 1.0) * fVar1,(21.0 - fVar7) * this->pixelsPerSquare,0);
  this_00 = (vector<Quad_*,_std::allocator<Quad_*>_> *)(**(code **)((long)*drawable + 0x40))();
  __end1 = std::vector<Quad_*,_std::allocator<Quad_*>_>::begin(this_00);
  quad = (Quad *)std::vector<Quad_*,_std::allocator<Quad_*>_>::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>
                                *)&quad);
    if (!bVar2) break;
    ppQVar5 = __gnu_cxx::__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>::
              operator*(&__end1);
    quad_00 = *ppQVar5;
    pVVar4 = (Vec2d *)(**(code **)(*(long *)(&drawable->field_0x0 +
                                            *(long *)((long)*drawable + -0x50)) + 0x30))
                                (&drawable->field_0x0 + *(long *)((long)*drawable + -0x50));
    drawQuad(this,quad_00,pVVar4,((float)iVar3 * 3.1415927) / 180.0);
    __gnu_cxx::__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>::operator++
              (&__end1);
  }
  glPopMatrix();
  return;
}

Assistant:

void PrimitiveDisplayer::drawableWithManualRotation(Drawable* drawable) {
    Vec2d* coords = drawable->getCoords();
    float rot = drawable->getRotation() * M_PI / 180;
    
    glPushMatrix();
        glTranslatef((coords->getX() + 1) * pixelsPerSquare, (21 - coords->getY()) * pixelsPerSquare, 0.f);
        for (auto quad : *drawable->getQuads()) {
            drawQuad(quad, drawable->getPivotPoint(), rot);
        }
    glPopMatrix();
    coords = nullptr;
}